

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

EVP_MD * EVP_get_digestbyobj(ASN1_OBJECT *obj)

{
  uint8_t *data;
  size_t len;
  undefined1 local_28 [8];
  CBS cbs;
  ASN1_OBJECT *obj_local;
  
  cbs.len = (size_t)obj;
  if (obj->nid == 0) {
    data = OBJ_get0_data(obj);
    len = OBJ_length((ASN1_OBJECT *)cbs.len);
    CBS_init((CBS *)local_28,data,len);
    obj_local = (ASN1_OBJECT *)cbs_to_md((CBS *)local_28);
  }
  else {
    obj_local = (ASN1_OBJECT *)EVP_get_digestbynid(obj->nid);
  }
  return (EVP_MD *)obj_local;
}

Assistant:

const EVP_MD *EVP_get_digestbyobj(const ASN1_OBJECT *obj) {
  // Handle objects with no corresponding OID. Note we don't use |OBJ_obj2nid|
  // here to avoid pulling in the OID table.
  if (obj->nid != NID_undef) {
    return EVP_get_digestbynid(obj->nid);
  }

  CBS cbs;
  CBS_init(&cbs, OBJ_get0_data(obj), OBJ_length(obj));
  return cbs_to_md(&cbs);
}